

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O2

bool VulkanUtilities::anon_unknown_1::IsExtensionAvailable
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions,
               char *ExtensionName)

{
  pointer pVVar1;
  pointer pVVar2;
  int iVar3;
  char (*in_RCX) [25];
  pointer __s1;
  VkExtensionProperties *Extension;
  string msg;
  string local_38;
  
  if (ExtensionName == (char *)0x0) {
    Diligent::FormatString<char[26],char[25]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ExtensionName != nullptr",in_RCX);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"IsExtensionAvailable",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x91);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pVVar1 = (Extensions->
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = (Extensions->
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    __s1 = pVVar2;
    if (__s1 == pVVar1) break;
    iVar3 = strcmp(__s1->extensionName,ExtensionName);
    pVVar2 = __s1 + 1;
  } while (iVar3 != 0);
  return __s1 != pVVar1;
}

Assistant:

bool IsExtensionAvailable(const std::vector<VkExtensionProperties>& Extensions, const char* ExtensionName)
{
    VERIFY_EXPR(ExtensionName != nullptr);

    for (const auto& Extension : Extensions)
    {
        if (strcmp(Extension.extensionName, ExtensionName) == 0)
            return true;
    }

    return false;
}